

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

void __thiscall
mjs::error_object::error_object
          (error_object *this,native_error_type type,string *class_name,object_ptr *prototype,
          string *stack_trace)

{
  property_attribute attributes;
  gc_heap_ptr<mjs::gc_string> *p;
  value local_58;
  string *local_30;
  string *stack_trace_local;
  object_ptr *prototype_local;
  string *class_name_local;
  error_object *peStack_10;
  native_error_type type_local;
  error_object *this_local;
  
  local_30 = stack_trace;
  stack_trace_local = (string *)prototype;
  prototype_local = (object_ptr *)class_name;
  class_name_local._4_4_ = type;
  peStack_10 = this;
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_002988f0;
  *(native_error_type *)&(this->super_native_object).field_0x24 = class_name_local._4_4_;
  value::value(&local_58,(string *)prototype_local);
  value_representation::value_representation(&this->name_,&local_58);
  value::~value(&local_58);
  p = string::unsafe_raw_get(local_30);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked(&this->stack_trace_,p);
  attributes = operator|(dont_enum,dont_delete);
  native_object::
  add_native_property<mjs::error_object,_&mjs::error_object::get_name,_&mjs::error_object::put_name>
            (&this->super_native_object,"name",attributes);
  return;
}

Assistant:

explicit error_object(native_error_type type, const string& class_name, const object_ptr& prototype, const string& stack_trace)
        : native_object{class_name, prototype}
        , type_(type)
        , name_(value_representation{value{class_name}})
        , stack_trace_(stack_trace.unsafe_raw_get()) {
        DEFINE_NATIVE_PROPERTY(error_object, name);
    }